

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O0

void __thiscall
CVmObjClass::CVmObjClass(CVmObjClass *this,int in_root_set,uint meta_idx,vm_obj_id_t self)

{
  vm_intcls_ext *this_00;
  undefined4 in_ECX;
  int in_EDX;
  CVmObject *in_RDI;
  vm_intcls_ext *ext;
  undefined4 in_stack_ffffffffffffffe8;
  
  CVmObject::CVmObject(in_RDI);
  in_RDI->_vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_004465c0;
  in_RDI->ext_ = (char *)0x0;
  this_00 = alloc_ext((CVmObjClass *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8));
  this_00->meta_idx = in_EDX;
  this_00->mod_obj = 0;
  vm_val_t::set_nil(&this_00->class_state);
  this_00->changed = 0;
  register_meta((CVmObjClass *)this_00,(vm_obj_id_t)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

CVmObjClass::CVmObjClass(VMG_ int in_root_set, uint meta_idx,
                         vm_obj_id_t self)
{
    /* calls of this form can't come from the image file */
    assert(!in_root_set);

    /* allocate the extension */
    ext_ = 0;
    vm_intcls_ext *ext = alloc_ext(vmg0_);

    /* set up the extension */
    ext->meta_idx = meta_idx;
    ext->mod_obj = VM_INVALID_OBJ;
    ext->class_state.set_nil();
    ext->changed = FALSE;

    /* register myself with the metaclass table */
    register_meta(vmg_ self);
}